

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::testQueriesForInvalidNameOfObject
          (ErrorsTest *this)

{
  ostringstream *poVar1;
  ErrorsTest *pEVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  GLuint GVar6;
  GLint buffer;
  GLint64 buffer64;
  GLint local_1d4;
  ErrorsTest *local_1d0;
  Enum<int,_2UL> local_1c8;
  GLint64 local_1b8;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  GVar6 = 0;
  do {
    GVar6 = GVar6 + 1;
    cVar3 = (**(code **)(lVar5 + 0xcd0))(GVar6);
  } while (cVar3 == '\x01');
  local_1d4 = 0x4cb2f;
  local_1b8 = 0x4cb2f;
  (*this->m_gl_getTransformFeedbackiv)(GVar6,0x8e23,&local_1d4);
  iVar4 = (**(code **)(lVar5 + 0x800))();
  if (iVar4 == 0x502) {
    if (local_1d4 == 0x4cb2f) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1d0 = this;
      while (iVar4 = (**(code **)(lVar5 + 0x800))(), pEVar2 = local_1d0, iVar4 != 0) {
        local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Warning! glGetTransformFeedbackiv called with invalid object name has generated more than one error, The next error was  "
                       );
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar4;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
        std::operator<<((ostream *)poVar1,".");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      (*local_1d0->m_gl_getTransformFeedbacki_v)(GVar6,0x8c8f,0,&local_1d4);
      iVar4 = (**(code **)(lVar5 + 0x800))();
      if (iVar4 == 0x502) {
        if (local_1d4 == 0x4cb2f) {
          poVar1 = (ostringstream *)(local_1b0 + 8);
          while (iVar4 = (**(code **)(lVar5 + 0x800))(), pEVar2 = local_1d0, iVar4 != 0) {
            local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,
                            "Warning! glGetTransformFeedbacki_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                           );
            local_1c8.m_getName = glu::getErrorName;
            local_1c8.m_value = iVar4;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
            std::operator<<((ostream *)poVar1,".");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
          }
          (*local_1d0->m_gl_getTransformFeedbacki64_v)(GVar6,0x8c84,0,&local_1b8);
          iVar4 = (**(code **)(lVar5 + 0x800))();
          if (iVar4 == 0x502) {
            if (local_1b8 == 0x4cb2f) {
              poVar1 = (ostringstream *)(local_1b0 + 8);
              while (iVar4 = (**(code **)(lVar5 + 0x800))(), iVar4 != 0) {
                local_1b0._0_8_ = ((local_1d0->super_TestCase).m_context)->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::operator<<((ostream *)poVar1,
                                "Warning! glGetTransformFeedbacki64_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                               );
                local_1c8.m_getName = glu::getErrorName;
                local_1c8.m_value = iVar4;
                tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
                std::operator<<((ostream *)poVar1,".");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
              }
              return true;
            }
            local_1b0._0_8_ = ((pEVar2->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),
                            "glGetTransformFeedbacki64_v called with invalid object name had been expected not to change the given buffer."
                           );
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_1b0._0_8_ = ((pEVar2->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,
                            "glGetTransformFeedbacki64_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                           );
            local_1c8.m_getName = glu::getErrorName;
            local_1c8.m_value = iVar4;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
            std::operator<<((ostream *)poVar1," was captured.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          local_1b0._0_8_ = ((pEVar2->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::operator<<((ostream *)(local_1b0 + 8),
                          "glGetTransformFeedbacki_v called with invalid object name had been expected not to change the given buffer."
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_1b0._0_8_ = ((pEVar2->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "glGetTransformFeedbacki_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                       );
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar4;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
        std::operator<<((ostream *)poVar1," was captured.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "glGetTransformFeedbackiv called with invalid object name had been expected not to change the given buffer."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbackiv called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                   );
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," was captured.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool ErrorsTest::testQueriesForInvalidNameOfObject()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generating not a-TransformFeedback name. */
	glw::GLuint invalid_name = 0;

	while (GL_TRUE == gl.isTransformFeedback(++invalid_name))
		;

	/* Dummy storage. */
	glw::GLint   buffer   = 314159;
	glw::GLint64 buffer64 = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(invalid_name, GL_TRANSFORM_FEEDBACK_PAUSED, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbackiv called with invalid object name has "
											   "generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki_v. */
	m_gl_getTransformFeedbacki_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, 0, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid object name has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki64_v. */
	m_gl_getTransformFeedbacki64_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_START, 0, &buffer64);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer64)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid object name "
											   "has unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	return true;
}